

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dag.cpp
# Opt level: O3

bool __thiscall DAGPropagator::propagateNewEdge(DAGPropagator *this,int e)

{
  pointer pTVar1;
  ulong *puVar2;
  int iVar3;
  int *piVar4;
  pointer pvVar5;
  uint *puVar6;
  bool bVar7;
  int iVar8;
  pointer pTVar9;
  pointer pvVar10;
  ulong uVar11;
  uint *puVar12;
  long lVar13;
  
  bVar7 = DReachabilityPropagator::propagateNewEdge(&this->super_DReachabilityPropagator,e);
  if ((!bVar7) ||
     (iVar8 = (*(this->super_DReachabilityPropagator).super_GraphPropagator.super_Propagator.
                _vptr_Propagator[0x18])(this,(ulong)(uint)e), (char)iVar8 == '\0')) {
    return false;
  }
  uVar11 = (ulong)e;
  piVar4 = (this->super_DReachabilityPropagator).super_GraphPropagator.endnodes.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar11].
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  iVar8 = *piVar4;
  pTVar1 = (this->succs).
           super__Vector_base<DAGPropagator::TrailedSuccList,_std::allocator<DAGPropagator::TrailedSuccList>_>
           ._M_impl.super__Vector_impl_data._M_start + iVar8;
  iVar3 = (pTVar1->super_TrailedConstantAccessList<std::pair<int,_int>,_Tint>).size.v;
  connectTo(this,iVar8,piVar4[1]);
  iVar8 = e + 0x3f;
  if (-1 < e) {
    iVar8 = e;
  }
  puVar2 = (this->processed_e).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
           (long)(iVar8 >> 6) +
           (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
  *puVar2 = *puVar2 | 1L << ((byte)e & 0x3f);
  pvVar10 = (this->super_DReachabilityPropagator).super_GraphPropagator.endnodes.
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pTVar9 = (this->succs).
           super__Vector_base<DAGPropagator::TrailedSuccList,_std::allocator<DAGPropagator::TrailedSuccList>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar8 = *pvVar10[uVar11].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((pTVar1 == pTVar9 + iVar8) &&
     (iVar3 == pTVar9[iVar8].super_TrailedConstantAccessList<std::pair<int,_int>,_Tint>.size.v)) {
    return true;
  }
  lVar13 = (long)iVar3;
  do {
    iVar8 = *(int *)(*(long *)&(pTVar1->super_TrailedConstantAccessList<std::pair<int,_int>,_Tint>).
                               dense.
                               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                               ._M_impl.super__Vector_impl_data + lVar13 * 8);
    pvVar5 = (this->super_DReachabilityPropagator).ou.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar12 = *(uint **)&pvVar5[iVar8].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data;
    puVar6 = (uint *)pvVar5[iVar8].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
    if (puVar12 != puVar6) {
      do {
        (*(this->super_DReachabilityPropagator).super_GraphPropagator.super_Propagator.
          _vptr_Propagator[0x19])(this,(ulong)*puVar12);
        puVar12 = puVar12 + 1;
      } while (puVar12 != puVar6);
      pvVar10 = (this->super_DReachabilityPropagator).super_GraphPropagator.endnodes.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar9 = (this->succs).
               super__Vector_base<DAGPropagator::TrailedSuccList,_std::allocator<DAGPropagator::TrailedSuccList>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    lVar13 = lVar13 + 1;
    iVar8 = *pvVar10[uVar11].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
  } while ((pTVar1 != pTVar9 + iVar8) ||
          (pTVar9[iVar8].super_TrailedConstantAccessList<std::pair<int,_int>,_Tint>.size.v !=
           (int)lVar13));
  return true;
}

Assistant:

bool DAGPropagator::propagateNewEdge(int e) {
	if (!DReachabilityPropagator::propagateNewEdge(e)) {
		return false;
	}

	if (!check_cycle(e)) {
		return false;
	}

	TrailedSuccList::const_iterator succ_taile = succs[getTail(e)].end();
	connectTo(getTail(e), getHead(e));
	processed_e[e] = true;

	// Only checking the new ones
	for (; succ_taile != succs[getTail(e)].end(); succ_taile++) {
		const int n = (*succ_taile).first;
		for (const int i : ou[n]) {
			prevent_cycle(i);
		}
	}
	/*
	//Check all reachable
	for (int n = 0; n < nbNodes(); n++) {
			if (reachable(n,getTail(e))) {
					for (int i = 0; i < in[n].size(); i++) {
							assert(!prevent_cycle(in[n][i])); //Assert because already checked before
					}
			}
	}
	*/

	/*    cout <<"Start "<<e<<endl;
	for (int i = 0; i < nbNodes(); i++) {
			for (int j = 0; j < nbNodes(); j++) {
					cout << reachability[i][j]<<",";
			}
			cout <<endl;
			}*/

	return true;
}